

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O0

cpool_bundle * cpool_add_bundle(cpool *cpool,connectdata *conn)

{
  void *pvVar1;
  cpool_bundle *bundle;
  connectdata *conn_local;
  cpool *cpool_local;
  
  cpool_local = (cpool *)cpool_bundle_create(conn->destination,conn->destination_len);
  if (cpool_local == (cpool *)0x0) {
    cpool_local = (cpool *)0x0;
  }
  else {
    pvVar1 = Curl_hash_add(&cpool->dest2bundle,&(cpool_local->dest2bundle).size,
                           (cpool_local->dest2bundle).slots,cpool_local);
    if (pvVar1 == (void *)0x0) {
      cpool_bundle_destroy((cpool_bundle *)cpool_local);
      cpool_local = (cpool *)0x0;
    }
  }
  return (cpool_bundle *)cpool_local;
}

Assistant:

static struct cpool_bundle *
cpool_add_bundle(struct cpool *cpool, struct connectdata *conn)
{
  struct cpool_bundle *bundle;

  bundle = cpool_bundle_create(conn->destination, conn->destination_len);
  if(!bundle)
    return NULL;

  if(!Curl_hash_add(&cpool->dest2bundle,
                    bundle->dest, bundle->dest_len, bundle)) {
    cpool_bundle_destroy(bundle);
    return NULL;
  }
  return bundle;
}